

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

wchar_t archive_read_open_filenames(archive_conflict *a,char **filenames,size_t block_size)

{
  int iVar1;
  wchar_t wVar2;
  size_t sVar3;
  archive *_a;
  archive_vtable_conflict *in_RDX;
  long *in_RSI;
  archive *in_RDI;
  char *filename;
  read_file_data *mine;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  archive *_a_00;
  long *plVar4;
  archive *_a_01;
  
  _a_00 = (archive *)0x0;
  plVar4 = in_RSI;
  if (in_RSI != (long *)0x0) {
    plVar4 = in_RSI + 1;
    _a_00 = (archive *)*in_RSI;
  }
  archive_clear_error(in_RDI);
  while( true ) {
    if (_a_00 == (archive *)0x0) {
      _a_00 = (archive *)0x1b2a60;
    }
    sVar3 = strlen((char *)_a_00);
    _a = (archive *)calloc(1,sVar3 + 0x28);
    if (_a == (archive *)0x0) {
      archive_set_error(in_RDI,0xc,"No memory");
      return L'\xffffffe2';
    }
    strcpy(&_a->field_0x24,(char *)_a_00);
    _a->vtable = in_RDX;
    _a->magic = 0xffffffff;
    *(undefined8 *)&_a->archive_format = 0;
    *(undefined1 *)((long)&_a->archive_format_name + 4) = 0;
    *(undefined4 *)&_a->archive_format_name = 0;
    if ((_a_00 == (archive *)0x0) || ((char)_a_00->magic == '\0')) {
      _a->compression_code = 0;
    }
    else {
      _a->compression_code = 1;
    }
    iVar1 = archive_read_append_callback_data
                      (_a_00,(void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (iVar1 != 0) {
      return L'\xffffffe2';
    }
    if (plVar4 == (long *)0x0) break;
    _a_01 = (archive *)(plVar4 + 1);
    _a_00 = (archive *)*plVar4;
    in_stack_ffffffffffffffcf = false;
    if (_a_00 != (archive *)0x0) {
      in_stack_ffffffffffffffcf = (char)_a_00->magic != '\0';
    }
    plVar4 = (long *)_a_01;
    if ((bool)in_stack_ffffffffffffffcf == false) {
LAB_0012f005:
      archive_read_set_open_callback(_a,(undefined1 *)_a_00);
      archive_read_set_read_callback(_a,(archive_read_callback *)_a_00);
      archive_read_set_skip_callback(_a,(archive_skip_callback *)_a_00);
      archive_read_set_close_callback(_a,(undefined1 *)_a_00);
      archive_read_set_switch_callback(_a,(archive_switch_callback *)_a_00);
      archive_read_set_seek_callback(_a,(archive_seek_callback *)_a_00);
      wVar2 = archive_read_open1(_a_01);
      return wVar2;
    }
  }
  _a_01 = (archive *)0x0;
  goto LAB_0012f005;
}

Assistant:

int
archive_read_open_filenames(struct archive *a, const char **filenames,
    size_t block_size)
{
	struct read_file_data *mine;
	const char *filename = NULL;
	if (filenames)
		filename = *(filenames++);

	archive_clear_error(a);
	do
	{
		if (filename == NULL)
			filename = "";
		mine = (struct read_file_data *)calloc(1,
			sizeof(*mine) + strlen(filename));
		if (mine == NULL)
			goto no_memory;
		strcpy(mine->filename.m, filename);
		mine->block_size = block_size;
		mine->fd = -1;
		mine->buffer = NULL;
		mine->st_mode = mine->use_lseek = 0;
		if (filename == NULL || filename[0] == '\0') {
			mine->filename_type = FNT_STDIN;
		} else
			mine->filename_type = FNT_MBS;
		if (archive_read_append_callback_data(a, mine) != (ARCHIVE_OK))
			return (ARCHIVE_FATAL);
		if (filenames == NULL)
			break;
		filename = *(filenames++);
	} while (filename != NULL && filename[0] != '\0');
	archive_read_set_open_callback(a, file_open);
	archive_read_set_read_callback(a, file_read);
	archive_read_set_skip_callback(a, file_skip);
	archive_read_set_close_callback(a, file_close);
	archive_read_set_switch_callback(a, file_switch);
	archive_read_set_seek_callback(a, file_seek);

	return (archive_read_open1(a));
no_memory:
	archive_set_error(a, ENOMEM, "No memory");
	return (ARCHIVE_FATAL);
}